

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

int __thiscall
CVmObjDict::getp_correct(CVmObjDict *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  wchar_t *pwVar1;
  ushort uVar2;
  wchar_t wVar3;
  corr_stack cVar4;
  size_t sVar5;
  CVmObjPageEntry *pCVar6;
  byte bVar7;
  vm_datatype_t *pvVar8;
  vm_val_t *pvVar9;
  corr_stack __ptr;
  int iVar10;
  int iVar11;
  uint uVar12;
  vm_obj_id_t vVar13;
  vm_obj_id_t vVar14;
  ushort *puVar15;
  size_t sVar16;
  wchar_t *buf;
  char *pcVar17;
  undefined8 *puVar18;
  long lVar19;
  long *plVar20;
  CVmObjPageEntry *this_00;
  vmdict_TrieNode **ppvVar21;
  undefined4 in_register_00000034;
  vmdict_TrieNode *pvVar22;
  ulong uVar23;
  corr_word *w;
  corr_state *ret;
  corr_stack stk;
  undefined8 *local_68;
  vm_val_t val;
  utf8_ptr rp;
  ulong local_40;
  
  if ((getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar10 = __cxa_guard_acquire(&getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                   CONCAT44(in_register_00000034,self)), iVar10 != 0)) {
    getp_correct::desc.min_argc_ = 2;
    getp_correct::desc.opt_argc_ = 0;
    getp_correct::desc.varargs_ = 0;
    __cxa_guard_release(&getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar10 = CVmObject::get_prop_check_argc(retval,argc,&getp_correct::desc);
  if (iVar10 == 0) {
    puVar15 = (ushort *)CVmBif::pop_str_val();
    iVar10 = CVmBif::pop_int_val();
    uVar2 = *puVar15;
    local_40 = 0;
    sVar16 = utf8_ptr::to_wchar((wchar_t *)0x0,0,(char *)(puVar15 + 1),(ulong)uVar2);
    buf = (wchar_t *)operator_new__(-(ulong)(sVar16 + 1 >> 0x3e != 0) | sVar16 * 4 + 4);
    utf8_ptr::to_wcharz(buf,sVar16 + 1,(char *)(puVar15 + 1),(ulong)uVar2);
    pcVar17 = (this->super_CVmObject).ext_;
    if (*(int *)(pcVar17 + 0x30) == 1) {
      plVar20 = *(long **)(pcVar17 + 0x28);
      local_40 = (**(code **)(*plVar20 + 0x1f0))(plVar20);
      pcVar17 = (this->super_CVmObject).ext_;
    }
    else {
      plVar20 = (long *)0x0;
    }
    pvVar22 = *(vmdict_TrieNode **)(pcVar17 + 0x38);
    if (pvVar22 == (vmdict_TrieNode *)0x0) {
      build_trie(this);
      pvVar22 = *(vmdict_TrieNode **)((this->super_CVmObject).ext_ + 0x38);
    }
    corr_stack::corr_stack(&stk,pvVar22);
    local_68 = (undefined8 *)0x0;
    while (__ptr.top = stk.top, stk.top != (corr_state *)0x0) {
      cVar4.top = (stk.top)->nxt;
      if (((stk.top)->node->word_cnt != 0) && ((stk.top)->ipos == sVar16)) {
        pwVar1 = (stk.top)->str;
        stk.top = cVar4.top;
        for (puVar18 = local_68; puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)*puVar18) {
          if ((puVar18[2] == (__ptr.top)->strl) &&
             (iVar11 = bcmp(puVar18 + 3,pwVar1,puVar18[2] << 2), iVar11 == 0)) {
            uVar23 = (ulong)*(uint *)(puVar18 + 1);
            goto LAB_0026dc3a;
          }
        }
        puVar18 = (undefined8 *)corr_word::operator_new(0x20,(__ptr.top)->strl);
        uVar23._0_4_ = (__ptr.top)->dist;
        uVar23._4_4_ = (__ptr.top)->repl;
        sVar5 = (__ptr.top)->strl;
        memcpy(puVar18 + 3,pwVar1,sVar5 * 4);
        puVar18[2] = sVar5;
        puVar18[1] = uVar23;
        *puVar18 = local_68;
        local_68 = puVar18;
LAB_0026dc3a:
        iVar11 = (__ptr.top)->dist;
        cVar4.top = stk.top;
        if ((iVar11 < (int)uVar23) ||
           ((iVar11 == (int)uVar23 && ((__ptr.top)->repl < *(int *)((long)puVar18 + 0xc))))) {
          *(int *)(puVar18 + 1) = iVar11;
          *(int *)((long)puVar18 + 0xc) = (__ptr.top)->repl;
        }
      }
      stk.top = cVar4.top;
      if ((((__ptr.top)->dist < iVar10) && ((__ptr.top)->ipos < sVar16)) &&
         ((__ptr.top)->typ != Deletion)) {
        corr_stack::push(&stk,(__ptr.top)->str,(__ptr.top)->strl,(__ptr.top)->dist + 1,
                         (__ptr.top)->repl,(__ptr.top)->ipos + 1,(__ptr.top)->node,Insertion);
      }
      pwVar1 = (__ptr.top)->str;
      ppvVar21 = &(__ptr.top)->node->chi;
      while (pvVar22 = *ppvVar21, pvVar22 != (vmdict_TrieNode *)0x0) {
        wVar3 = pvVar22->ch;
        (__ptr.top)->str[(__ptr.top)->strl] = wVar3;
        uVar23 = (__ptr.top)->ipos;
        if (uVar23 < sVar16) {
          if (plVar20 == (long *)0x0) {
            bVar7 = 1;
            lVar19 = 1;
            if (buf[uVar23] == wVar3) goto LAB_0026dd36;
          }
          else {
            lVar19 = (**(code **)(*plVar20 + 0x1e8))(plVar20);
            if (lVar19 == 0) {
              bVar7 = 1;
            }
            else {
              uVar23 = (__ptr.top)->ipos;
LAB_0026dd36:
              corr_stack::push(&stk,pwVar1,(__ptr.top)->strl + 1,(__ptr.top)->dist,(__ptr.top)->repl
                               ,uVar23 + lVar19,pvVar22,NoChange);
              bVar7 = 0;
            }
          }
        }
        else {
          bVar7 = 1;
          if ((local_40 != 0) && (local_40 <= uVar23 && local_40 <= (__ptr.top)->strl)) {
            corr_stack::push(&stk,pwVar1,(__ptr.top)->strl + 1,(__ptr.top)->dist,(__ptr.top)->repl,
                             uVar23,pvVar22,NoChange);
          }
        }
        if ((__ptr.top)->dist < iVar10) {
          if (!(bool)(bVar7 ^ 1) && (__ptr.top)->ipos < sVar16) {
            corr_stack::push(&stk,pwVar1,(__ptr.top)->strl + 1,(__ptr.top)->dist + 1,
                             (__ptr.top)->repl + 1,(__ptr.top)->ipos + 1,pvVar22,Replacement);
          }
          if ((__ptr.top)->typ != Insertion) {
            corr_stack::push(&stk,pwVar1,(__ptr.top)->strl + 1,(__ptr.top)->dist + 1,
                             (__ptr.top)->repl,(__ptr.top)->ipos,pvVar22,Deletion);
            goto LAB_0026ddd0;
          }
        }
        else {
LAB_0026ddd0:
          if ((((__ptr.top)->typ == Replacement) &&
              (uVar23 = (__ptr.top)->ipos, uVar23 < sVar16 && uVar23 != 0)) &&
             ((buf[uVar23 - 1] == pvVar22->ch &&
              (buf[uVar23] == (__ptr.top)->str[(__ptr.top)->strl - 1])))) {
            corr_stack::push(&stk,pwVar1,(__ptr.top)->strl + 1,(__ptr.top)->dist,
                             (__ptr.top)->repl + -1,uVar23 + 1,pvVar22,Transposition);
          }
        }
        ppvVar21 = &pvVar22->nxt;
      }
      free(__ptr.top);
    }
    operator_delete__(buf);
    uVar12 = 0;
    for (puVar18 = local_68; puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)*puVar18) {
      uVar12 = (uVar12 + 1) - (uint)(*(int *)(puVar18 + 1) == 0);
    }
    iVar10 = 0;
    vVar13 = CVmObjList::create(0,(ulong)uVar12);
    pCVar6 = G_obj_table_X.pages_[vVar13 >> 0xc];
    CVmObjList::cons_clear((CVmObjList *)(pCVar6 + (vVar13 & 0xfff)));
    pvVar9 = sp_;
    pvVar8 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar8 = VM_OBJ;
    (pvVar9->val).obj = vVar13;
    for (puVar18 = local_68; puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)*puVar18) {
      if (*(int *)(puVar18 + 1) != 0) {
        val.val.obj = CVmObjList::create(0,3);
        this_00 = G_obj_table_X.pages_[val.val.obj >> 0xc] + (val.val.obj & 0xfff);
        val.typ = VM_OBJ;
        CVmObjList::cons_set_element((CVmObjList *)(pCVar6 + (vVar13 & 0xfff)),(long)iVar10,&val);
        rp.p_ = (char *)0x0;
        sVar16 = utf8_ptr::setwchars(&rp,(wchar_t *)(puVar18 + 3),puVar18[2],0);
        vVar14 = CVmObjString::create(0,sVar16);
        rp.p_ = (char *)(*(long *)((long)&G_obj_table_X.pages_[vVar14 >> 0xc][vVar14 & 0xfff].ptr_ +
                                  8) + 2);
        utf8_ptr::setwchars(&rp,(wchar_t *)(puVar18 + 3),puVar18[2],sVar16);
        val.typ = VM_OBJ;
        val.val.obj = vVar14;
        CVmObjList::cons_set_element((CVmObjList *)this_00,0,&val);
        val.val.obj = *(undefined4 *)(puVar18 + 1);
        val.typ = VM_INT;
        CVmObjList::cons_set_element((CVmObjList *)this_00,1,&val);
        val.val.obj = *(vm_obj_id_t *)((long)puVar18 + 0xc);
        val.typ = VM_INT;
        CVmObjList::cons_set_element((CVmObjList *)this_00,2,&val);
        iVar10 = iVar10 + 1;
      }
    }
    while (local_68 != (undefined8 *)0x0) {
      puVar18 = (undefined8 *)*local_68;
      free(local_68);
      local_68 = puVar18;
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar13;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_correct(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    const char *str;
    size_t strl;
    int max_dist;
    static CVmNativeCodeDesc desc(2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the word string and maximum edit distance */
    str = CVmBif::pop_str_val(vmg0_);
    max_dist = CVmBif::pop_int_val(vmg0_);

    /* get the string length and character pointer */
    strl = vmb_get_len(str);
    str += VMB_LEN;

    /* for easier processing, convert the string to a wchar_t array */
    size_t wcnt = utf8_ptr::to_wcharz(0, 0, str, strl);
    wchar_t *wstr = new wchar_t[wcnt+1];
    utf8_ptr::to_wcharz(wstr, wcnt+1, str, strl);

    /* if we have a StringComparator, fetch it */
    CVmObjStrComp *cmp = 0;
    size_t trunc_len = 0;
    if (get_ext()->comparator_type_ == VMDICT_COMP_STRCOMP)
    {
        /* get the comparator */
        cmp = (CVmObjStrComp *)get_ext()->comparator_obj_;

        /* note the truncation length */
        trunc_len = cmp->trunc_len();
    }

    /* if we don't have the Trie yet, build it */
    if (get_ext()->trie_ == 0)
        build_trie(vmg0_);

    /* create a stack with the initial empty state */
    corr_stack stk(get_ext()->trie_);

    /* start with an empty result list */
    corr_word *results = 0;

    /* process states until the stack is empty */
    while (!stk.empty())
    {
        /* pop the next state */
        corr_state *s = stk.pop();

        /* 
         *   Check for an 'accept' state.  This is a state where we've
         *   exhausted the input word, and we're at a Trie node that has at
         *   least one word defined.
         */
        if (s->node->word_cnt != 0 && s->ipos == wcnt)
        {
            /*
             *   We've found a matching word (i.e., a candidate dictionary
             *   match for the misspelled input word).  Scan the list of
             *   candidates we've already found to see if we've already
             *   matched this word.
             */
            corr_word *w;
            for (w = results ; w != 0 ; w = w->nxt)
            {
                if (w->strl == s->strl
                    && memcmp(w->str, s->str, s->strl*sizeof(wchar_t)) == 0)
                    break;
            }

            /* if we didn't find an entry, add a new one */
            if (w == 0)
                results = w = new (s->strl) corr_word(
                    s->str, s->strl, s->dist, s->repl, results);

            /* keep the lowest edit distance we've found so far */
            if (s->dist < w->dist
                || (s->dist == w->dist && s->repl < w->repl))
            {
                w->dist = s->dist;
                w->repl = s->repl;
            }
        }

        /*
         *   If we have any edit distance left, try an insertion (i.e., the
         *   input word has an extra letter relative to the dictionary word).
         *   Don't do insertions directly after deletions, though, since
         *   they'd just cancel out.  
         */
        if (s->dist < max_dist && s->ipos < wcnt && s->typ != Deletion)
            stk.push(s->str, s->strl, s->dist + 1, s->repl, s->ipos + 1,
                     s->node, Insertion);

        /* try each possible dictionary transition from here */
        for (vmdict_TrieNode *chi = s->node->chi ; chi != 0 ;
             chi = chi->nxt)
        {
            /* 
             *   Build the next-state string.  Note that we can just add the
             *   character directly to the current state's string buffer,
             *   since we always allocate state structures with one extra
             *   character of padding for just this purpose. 
             */
            s->str[s->strl] = chi->ch;

            /* 
             *   Check for a match to the current character.  If we have a
             *   StringComparator, ask the comparator to check the match.
             *   Otherwise just check for an exact character match. 
             */
            size_t matchlen = 0;
            if (s->ipos < wcnt)
            {
                if (cmp != 0)
                {
                    /* we have a comparator - check it for the match */
                    matchlen = cmp->match_chars(
                        wstr + s->ipos, wcnt - s->ipos, chi->ch);
                }
                else
                {
                    /* no comparator - do a simple character comparison */
                    if (wstr[s->ipos] == chi->ch)
                        matchlen = 1;
                }
                
                /* if we have a match, push a state for it */
                if (matchlen != 0)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos + matchlen, chi, NoChange);
            }
            else
            {
                /* 
                 *   we've reached the end of the input; but if the current
                 *   edit string is at least the truncation length in the
                 *   string comparator, consider this a character match as
                 *   well 
                 */
                if (trunc_len != 0
                    && s->strl >= trunc_len
                    && s->ipos >= trunc_len)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos, chi, NoChange);
            }

            /* if we have any edit distance remaining, try corrections */
            if (s->dist < max_dist)
            {
                /* try a replaced letter */
                if (s->ipos < wcnt && matchlen == 0)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl + 1,
                             s->ipos + 1, chi, Replacement);

                /* try a deletion (i.e., the input is missing a character) */
                if (s->typ != Insertion)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl,
                             s->ipos, chi, Deletion);
            }

            /* 
             *   if we just did a replacement edit, check to see if it's
             *   actually a transposition 
             */
            if (s->typ == Replacement
                && s->ipos > 0 && s->ipos < wcnt
                && wstr[s->ipos - 1] == chi->ch
                && wstr[s->ipos] == s->str[s->strl - 1])
                stk.push(s->str, s->strl + 1, s->dist, s->repl - 1,
                         s->ipos + 1, chi, Transposition);
        }

        /* we've finished processing the current state */
        delete s;
    }

    /* done with the wchar_t version of the word */
    delete [] wstr;

    /* 
     *   Count up the number of result entries.  Only count words with a
     *   non-zero edit distance - words with a zero edit distance are already
     *   matches for the input word, so we can't consider them to be
     *   corrections for it. 
     */
    corr_word *r;
    int i;
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        /* if this word has a non-zero edit distance, count it */
        if (r->dist != 0)
            ++i;
    }

    /* allocate a List to hold the results */
    vm_obj_id_t lst_id = CVmObjList::create(vmg_ FALSE, i);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_id);
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push()->set_obj(lst_id);

    /* create a List [word, distance] for each result */
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        vm_val_t val;

        /* 
         *   If this word has a zero edit distance, skip it.  A word with a
         *   zero edit distance is already a match for the original, so it
         *   can't be considered a correction.  
         */
        if (r->dist == 0)
            continue;
        
        /* create the sublist */
        vm_obj_id_t sub_id = CVmObjList::create(vmg_ FALSE, 3);
        CVmObjList *sub = (CVmObjList *)vm_objp(vmg_ sub_id);

        /* add it to the main list */
        val.set_obj(sub_id);
        lst->cons_set_element(i, &val);

        /* measure the utf8 space needed for the string */
        utf8_ptr rp;
        size_t rplen = rp.setwchars(r->str, r->strl, 0);

        /* create the word string */
        vm_obj_id_t lstr_id = CVmObjString::create(vmg_ FALSE, rplen);
        CVmObjString *lstr = (CVmObjString *)vm_objp(vmg_ lstr_id);

        /* encode it */
        rp.set(lstr->cons_get_buf());
        rp.setwchars(r->str, r->strl, rplen);

        /* add it to the sublist */
        val.set_obj(lstr_id);
        sub->cons_set_element(0, &val);

        /* add the edit distance */
        val.set_int(r->dist);
        sub->cons_set_element(1, &val);

        /* add the character replacement count */
        val.set_int(r->repl);
        sub->cons_set_element(2, &val);

        /* count it */
        ++i;
    }

    /* delete the result list */
    while (results != 0)
    {
        /* unlink this element */
        r = results;
        results = results->nxt;

        /* delete it */
        delete r;
    }

    /* return the list value */
    retval->set_obj(lst_id);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}